

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall JsonObject_TwoKvps_Test::TestBody(JsonObject_TwoKvps_Test *this)

{
  StrictMock<mock_json_callbacks> *this_00;
  TypedExpectation<std::error_code_()> *pTVar1;
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar2;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  TypedExpectation<std::error_code_(bool)> *this_02;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *this_03;
  char *in_R9;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  InSequence _;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  testing::InSequence::InSequence(&_);
  this_00 = &(this->super_JsonObject).callbacks_;
  p.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )mock_json_callbacks::gmock_begin_object((MockSpec<std::error_code_()> *)this_00,in_RSI);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)&p,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0x5c,"callbacks_","begin_object ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar1,1);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_f0,"a");
  mock_json_callbacks::gmock_key
            ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&p,&this_00->super_mock_json_callbacks,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_f0);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&p,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0x5d,"callbacks_","key (\"a\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar2,1);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&p.stack_);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_f0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_f0,1);
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)&p,&this_00->super_mock_json_callbacks,
             (Matcher<unsigned_long> *)&local_f0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)&p,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                       ,0x5e,"callbacks_","uint64_value (1)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&p.stack_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_f0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_f0,"b");
  mock_json_callbacks::gmock_key
            ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&p,&this_00->super_mock_json_callbacks,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_f0);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&p,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0x5f,"callbacks_","key (\"b\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar2,1);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&p.stack_);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_f0);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_f0,true);
  mock_json_callbacks::gmock_boolean_value
            ((MockSpec<std::error_code_(bool)> *)&p,&this_00->super_mock_json_callbacks,
             (Matcher<bool> *)&local_f0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<std::error_code_(bool)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(bool)> *)&p,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                       ,0x60,"callbacks_","boolean_value (true)");
  this_03 = (mock_json_callbacks *)0x1;
  testing::internal::TypedExpectation<std::error_code_(bool)>::Times(this_02,1);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&p.stack_);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_f0);
  p.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )mock_json_callbacks::gmock_end_object((MockSpec<std::error_code_()> *)this_00,this_03);
  testing::internal::GetWithoutMatchers();
  extensions = 0x16d83b;
  pTVar1 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)&p,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0x61,"callbacks_","end_object ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar1,1);
  testing::InSequence::~InSequence(&_);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            (&p,(json *)&(this->super_JsonObject).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0
             ,extensions);
  std::__cxx11::string::string((string *)&local_f0,"{\"a\":1, \"b\" : true }",(allocator *)&_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(&p);
  local_b8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  _.sequence_created_ = p.error_._M_value == 0;
  if (!_.sequence_created_) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&_,(AssertionResult *)"p.has_error ()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x66,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (local_c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_c8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonObject, TwoKvps) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_object ()).Times (1);
        EXPECT_CALL (callbacks_, key ("a")).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
        EXPECT_CALL (callbacks_, key ("b")).Times (1);
        EXPECT_CALL (callbacks_, boolean_value (true)).Times (1);
        EXPECT_CALL (callbacks_, end_object ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input (std::string{"{\"a\":1, \"b\" : true }"});
    p.eof ();
    EXPECT_FALSE (p.has_error ());
}